

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.hpp
# Opt level: O3

tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_bool>
__thiscall
pstore::command_line::details::
parse_option_arguments<std::__cxx11::string*,std::__cxx11::ostringstream>
          (details *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *first_arg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *last_arg,
          string *program_name,
          basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *errs)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  type *ptVar4;
  option **ppoVar5;
  ostream *poVar6;
  string *psVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_05;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_06;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_07;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_09;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  byte bVar9;
  byte bVar10;
  uint uVar11;
  bool bVar13;
  details dVar14;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_bool>
  tVar15;
  maybe<pstore::command_line::option_*,_void> handler;
  string arg_name;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void> value
  ;
  maybe<pstore::command_line::option_*,_void> local_168;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  *local_150;
  string *local_148;
  details local_140 [8];
  option *local_138;
  maybe<pstore::command_line::option_*,_void> local_130;
  maybe<pstore::command_line::option_*,_void> local_120;
  string local_110;
  details *local_f0;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  local_e8;
  long *local_b8 [2];
  long local_a8 [2];
  string local_98;
  undefined1 local_78 [8];
  type local_70;
  long *local_50 [2];
  long local_40 [2];
  uint uVar12;
  
  local_e8.storage_._8_8_ = 0;
  local_e8.storage_._16_8_ = 0;
  local_e8._0_8_ = 0;
  local_e8.storage_.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_e8.storage_._24_8_ = 0;
  local_168._0_8_ = 0;
  local_168.storage_ = (type)0x0;
  local_150 = (maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
               *)program_name;
  local_148 = (string *)errs;
  if (first_arg == last_arg) {
    _Var8._M_head_impl = last_arg;
    bVar10 = 1;
  }
  else {
    uVar12 = 1;
    local_f0 = this;
    do {
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      pcVar1 = (first_arg->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,pcVar1,pcVar1 + first_arg->_M_string_length);
      local_120.valid_ = false;
      bVar13 = local_168.valid_ == true;
      if (bVar13) {
        ptVar4 = (type *)maybe<pstore::command_line::option_*,_void>::operator->(&local_168);
        local_120.storage_ = *ptVar4;
      }
      local_120.valid_ = bVar13;
      bVar13 = handler_takes_argument(&local_120);
      if (local_120.valid_ == true) {
        local_120.valid_ = false;
      }
      if (bVar13) {
        local_130.valid_ = false;
        bVar13 = local_168.valid_ == true;
        if (bVar13) {
          ptVar4 = (type *)maybe<pstore::command_line::option_*,_void>::operator->(&local_168);
          local_130.storage_ = *ptVar4;
        }
        local_130.valid_ = bVar13;
        bVar13 = handler_set_value(&local_130,&local_110);
        uVar11 = uVar12 & 0xff;
        if ((uVar12 & 1) != 0) {
          uVar11 = (uint)bVar13;
        }
        if (local_130.valid_ == true) {
          local_130.valid_ = false;
        }
        _Var8._M_head_impl = extraout_RDX;
        if (local_168.valid_ == true) {
          local_168._0_8_ = local_168._0_8_ & 0xffffffffffffff00;
        }
        goto LAB_00137f94;
      }
      iVar3 = std::__cxx11::string::compare((char *)&local_110);
      if (iVar3 == 0) {
        first_arg = first_arg + 1;
        bVar13 = true;
        _Var8._M_head_impl = extraout_RDX_00;
      }
      else {
        bVar2 = argument_is_positional(&local_110);
        bVar13 = true;
        _Var8._M_head_impl = extraout_RDX_01;
        if (!bVar2) {
          bVar13 = starts_with(&local_110,"--");
          if (bVar13) {
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_98,local_110._M_dataplus._M_p,
                       local_110._M_dataplus._M_p + local_110._M_string_length);
            get_option_and_value
                      ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                        *)local_78,&local_98);
            std::__cxx11::string::operator=((string *)&local_110,(string *)local_50);
            maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
            ::operator=(&local_e8,
                        (maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                         *)local_78);
            if (local_50[0] != local_40) {
              operator_delete(local_50[0],local_40[0] + 1);
            }
            if (local_78[0] == true) {
              local_78._0_4_ = local_78._0_4_ & 0xffffff00;
              if ((undefined1 *)CONCAT71(local_70._1_7_,local_70.__data[0]) != local_78 + 0x18) {
                operator_delete((undefined1 *)CONCAT71(local_70._1_7_,local_70.__data[0]),
                                local_70._16_8_ + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            find_handler((maybe<pstore::command_line::option_*,_void> *)local_78,&local_110);
            maybe<pstore::command_line::option_*,_void>::operator=
                      (&local_168,(maybe<pstore::command_line::option_*,_void> *)local_78);
            if (local_168.valid_ == true) {
              ppoVar5 = maybe<pstore::command_line::option_*,_void>::operator->(&local_168);
              iVar3 = (*(*ppoVar5)->_vptr_option[9])();
              if ((char)iVar3 == '\0') {
                local_140[0] = (details)0x0;
                dVar14 = (details)(local_168.valid_ == true);
                if ((bool)dVar14) {
                  ppoVar5 = maybe<pstore::command_line::option_*,_void>::operator->(&local_168);
                  local_138 = *ppoVar5;
                }
                errs = (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_148;
                local_140[0] = dVar14;
                record_value_if_available<std::__cxx11::ostringstream>
                          ((tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool> *)
                           local_78,local_140,
                           (maybe<pstore::command_line::option_*,_void> *)&local_e8,local_150,
                           local_148,in_R9);
                maybe<pstore::command_line::option_*,_void>::operator=
                          (&local_168,(maybe<pstore::command_line::option_*,_void> *)(local_78 + 8))
                ;
                uVar11 = local_78._0_4_;
                if ((uVar12 & 1) == 0) {
                  uVar11 = uVar12 & 0xff;
                }
                _Var8._M_head_impl = extraout_RDX_06;
                if (local_140[0] == (details)0x1) {
                  local_140[0] = (details)0x0;
                }
                goto LAB_00137f94;
              }
            }
            report_unknown_option<std::__cxx11::ostringstream>
                      ((string *)local_150,&local_110,&local_e8,
                       (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_148);
            bVar13 = false;
            uVar11 = uVar12 & 1;
            _Var8._M_head_impl = extraout_RDX_02;
            uVar12 = uVar12 & 0xff;
            if (uVar11 != 0) {
              uVar12 = 0;
            }
          }
          else {
            local_b8[0] = local_a8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_b8,local_110._M_dataplus._M_p,
                       local_110._M_dataplus._M_p + local_110._M_string_length);
            process_single_dash<std::__cxx11::ostringstream>
                      ((tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool> *)local_78,
                       (details *)local_b8,(string *)local_150,local_148,errs);
            maybe<pstore::command_line::option_*,_void>::operator=
                      (&local_168,(maybe<pstore::command_line::option_*,_void> *)(local_78 + 8));
            uVar11 = local_78._0_4_;
            if ((uVar12 & 1) == 0) {
              uVar11 = uVar12 & 0xff;
            }
            if ((bool)local_70.__data[0] == true) {
              local_70.__data[0] = false;
            }
            _Var8._M_head_impl = extraout_RDX_04;
            if (local_b8[0] != local_a8) {
              operator_delete(local_b8[0],local_a8[0] + 1);
              _Var8._M_head_impl = extraout_RDX_05;
            }
LAB_00137f94:
            bVar13 = false;
            uVar12 = uVar11;
          }
        }
      }
      bVar9 = (byte)uVar12;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        _Var8._M_head_impl = extraout_RDX_03;
      }
    } while ((!bVar13) && (first_arg = first_arg + 1, first_arg != last_arg));
    this = local_f0;
    bVar10 = bVar9;
    if ((local_168._0_8_ & 1) != 0) {
      ppoVar5 = maybe<pstore::command_line::option_*,_void>::operator->(&local_168);
      iVar3 = (*(*ppoVar5)->_vptr_option[0xe])();
      this = local_f0;
      _Var8._M_head_impl = extraout_RDX_07;
      if ((char)iVar3 != '\0') {
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_148,*(char **)local_150,
                            (long)(local_150->storage_).__align);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,": Argument \'",0xc);
        ppoVar5 = maybe<pstore::command_line::option_*,_void>::operator->(&local_168);
        psVar7 = option::name_abi_cxx11_(*ppoVar5);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(psVar7->_M_dataplus)._M_p,psVar7->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\' requires a value\n",0x13);
        _Var8._M_head_impl = extraout_RDX_08;
        bVar10 = 0;
        if ((uVar12 & 1) == 0) {
          bVar10 = bVar9;
        }
      }
    }
  }
  *this = (details)(bVar10 & 1);
  *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(this + 8) = first_arg;
  if ((local_e8.valid_ == true) &&
     (local_e8._0_8_ = local_e8._0_8_ & 0xffffffffffffff00,
     local_e8.storage_.__align !=
     (anon_struct_8_0_00000001_for___align)((long)&local_e8.storage_ + 0x10))) {
    operator_delete((void *)local_e8.storage_.__align,local_e8.storage_._16_8_ + 1);
    _Var8._M_head_impl = extraout_RDX_09;
  }
  tVar15.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_bool>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = _Var8._M_head_impl;
  tVar15.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_bool>
  ._0_8_ = this;
  return (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_bool>
          )tVar15.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_bool>
  ;
}

Assistant:

std::tuple<InputIterator, bool>
            parse_option_arguments (InputIterator first_arg, InputIterator last_arg,
                                    std::string const & program_name, ErrorStream & errs) {
                using str = stream_trait<typename ErrorStream::char_type>;
                auto value = nothing<std::string> ();
                auto handler = nothing<option *> ();
                sticky_bool<false> ok{true};

                for (; first_arg != last_arg; ++first_arg) {
                    std::string arg_name = *first_arg;
                    // Is this the argument for the preceeding switch?
                    if (handler_takes_argument (handler)) {
                        ok = handler_set_value (handler, arg_name);
                        handler.reset ();
                        continue;
                    }

                    // A double-dash argument on its own indicates that the following are
                    // positional arguments.
                    if (arg_name == "--") {
                        ++first_arg; // swallow this argument.
                        break;
                    }
                    // If this argument has no leading dash, this and the following are
                    // positional arguments.
                    if (argument_is_positional (arg_name)) {
                        break;
                    }

                    if (starts_with (arg_name, "--")) {
                        std::tie (arg_name, value) = get_option_and_value (arg_name);

                        handler = find_handler (arg_name);
                        if (!handler || (*handler)->is_positional ()) {
                            report_unknown_option (program_name, arg_name, value, errs);
                            ok = false;
                            continue;
                        }

                        std::tie (handler, ok) =
                            record_value_if_available (handler, value, program_name, errs);
                    } else {
                        std::tie (handler, ok) = process_single_dash (arg_name, program_name, errs);
                    }
                }

                if (handler && (*handler)->takes_argument ()) {
                    errs << str::out_string (program_name) << str::out_text (": Argument '")
                         << str::out_string ((*handler)->name ())
                         << str::out_text ("' requires a value\n");
                    ok = false;
                }
                return std::make_tuple (first_arg, static_cast<bool> (ok));
            }